

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::test_LockDirectory::test_method(test_LockDirectory *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  LockResult LVar4;
  __pid_t _Var5;
  __sighandler_t __handler;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 local_4d4 [4];
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  int processstatus;
  thread local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  LockResult threadresult;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  thread thr;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char ch;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  pid_t pid;
  lazy_ostream local_1c0;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  thread *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined1 *local_168;
  thread **local_160;
  thread *local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined1 *local_140;
  thread **local_138;
  char *local_130;
  char *local_128;
  assertion_result local_120;
  path local_108;
  path local_e0;
  int fd [2];
  path lockname;
  path local_88;
  path dirname;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,8,"lock_dir");
  std::filesystem::__cxx11::path::path(&dirname.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_150 = (undefined **)0xf72c04;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&lockname.super_path,(char **)&local_150,auto_format);
  __handler = signal(0x11,(__sighandler_t)0x0);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x49f;
  file.m_begin = (iterator)&local_190;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a0,msg);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  thr._M_id._M_thread._0_4_ = socketpair(1,1,0,fd);
  local_158 = &thr;
  local_180 = &local_348;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((LockResult)thr._M_id._M_thread == 0);
  local_348._M_id._M_thread._0_4_ = 0;
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_138 = &local_158;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abcf0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c0a,(size_t)&local_130,0x49f,&local_150,"0",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  pid = fork();
  if (pid == 0) {
    local_1d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1d0 = "";
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_27.m_end = (iterator)0x4a2;
    file_27.m_begin = (iterator)&local_1d8;
    msg_27.m_end = pvVar7;
    msg_27.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1e8,
               msg_27);
    local_1c0.m_empty = false;
    local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
    local_1b0 = boost::unit_test::lazy_ostream::inst;
    local_1a8 = "";
    iVar3 = close(fd[1]);
    thr._M_id._M_thread._0_4_ = iVar3;
    local_348._M_id._M_thread = (id)((ulong)local_348._M_id._M_thread._4_4_ << 0x20);
    local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar3 == 0);
    local_120.m_message.px = (element_type *)0x0;
    local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_128 = "";
    local_158 = &thr;
    local_148 = 0;
    local_150 = &PTR__lazy_ostream_013abcf0;
    local_140 = boost::unit_test::lazy_ostream::inst;
    local_138 = &local_158;
    local_180 = &local_348;
    local_170 = 0;
    local_178 = &PTR__lazy_ostream_013abcf0;
    local_168 = boost::unit_test::lazy_ostream::inst;
    local_160 = &local_180;
    boost::test_tools::tt_detail::report_assertion
              (&local_120,&local_1c0,1,2,REQUIRE,0xf72c2c,(size_t)&local_130,0x4a2,&local_150,"0",
               &local_178);
    boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
    std::filesystem::__cxx11::path::path(&local_e0,&dirname.super_path);
    std::filesystem::__cxx11::path::path(&local_108,&lockname.super_path);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      TestOtherProcess((path *)&local_e0,(path *)&local_108,fd[0]);
    }
    goto LAB_0073f492;
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4a5;
  file_00.m_begin = (iterator)&local_1f8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
             msg_00);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  iVar3 = close(fd[0]);
  thr._M_id._M_thread._0_4_ = iVar3;
  local_348._M_id._M_thread._0_4_ = 0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abcf0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = &local_348;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c39,(size_t)&local_130,0x4a5,&local_150,"0",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4a9;
  file_01.m_begin = (iterator)&local_220;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_230,
             msg_01);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  thr._M_id._M_thread = (id)write(fd[1],&LockCommand,1);
  local_348._M_id._M_thread._0_4_ = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(thr._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c46,(size_t)&local_130,0x4a9,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4aa;
  file_02.m_begin = (iterator)&local_248;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_258,
             msg_02);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  thr._M_id._M_thread = (id)read(fd[1],(thread *)&ch,1);
  local_348._M_id._M_thread._0_4_ = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(thr._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c64,(size_t)&local_130,0x4aa,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4ab;
  file_03.m_begin = (iterator)&local_268;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_278,
             msg_03);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  thr._M_id._M_thread._0_1_ = 3;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ch == '\x03');
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013ad180;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = &thr;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b1120;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = (thread *)&ch;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf898ef,(size_t)&local_130,0x4ab,&local_150,
             "ResErrorWrite",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4ae;
  file_04.m_begin = (iterator)&local_288;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_298,
             msg_04);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,false);
  thr._M_id._M_thread._0_4_ = LVar4;
  local_348._M_id._M_thread._0_4_ = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == ErrorWrite);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c86,(size_t)&local_130,0x4ae,&local_150,
             "util::LockResult::ErrorWrite",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  cVar2 = std::filesystem::symlink_status(&dirname.super_path);
  if (cVar2 == '\x03') {
    cVar2 = std::filesystem::status(&dirname.super_path);
    if (cVar2 != '\x02') goto LAB_0073cf3d;
  }
  else {
LAB_0073cf3d:
    std::filesystem::create_directories(&dirname.super_path);
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4b3;
  file_05.m_begin = (iterator)&local_2a8;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2b8,
             msg_05);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,true);
  thr._M_id._M_thread._0_4_ = LVar4;
  local_348._M_id._M_thread = (id)((ulong)local_348._M_id._M_thread & 0xffffffff00000000);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72cca,(size_t)&local_130,0x4b3,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4b6;
  file_06.m_begin = (iterator)&local_2c8;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2d8,
             msg_06);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,false);
  thr._M_id._M_thread._0_4_ = LVar4;
  local_348._M_id._M_thread = (id)((ulong)local_348._M_id._M_thread & 0xffffffff00000000);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c86,(size_t)&local_130,0x4b6,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4b9;
  file_07.m_begin = (iterator)&local_2e8;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2f8,
             msg_07);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,false);
  thr._M_id._M_thread._0_4_ = LVar4;
  local_348._M_id._M_thread = (id)((ulong)local_348._M_id._M_thread & 0xffffffff00000000);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &thr;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = &local_348;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c86,(size_t)&local_130,0x4b9,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  thr._M_id._M_thread = (id)0;
  local_150 = (undefined **)operator_new(0x20);
  *local_150 = (undefined *)&PTR___State_013b1160;
  local_150[1] = (undefined *)&threadresult;
  local_150[2] = (undefined *)&dirname;
  local_150[3] = (undefined *)&lockname;
  std::thread::_M_start_thread(&thr,&local_150,0);
  if (local_150 != (undefined **)0x0) {
    (**(code **)(*local_150 + 8))();
  }
  std::thread::join();
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x4bf;
  file_08.m_begin = (iterator)&local_310;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_320,
             msg_08);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(threadresult == Success);
  local_348._M_id._M_thread = (id)((ulong)local_348._M_id._M_thread & 0xffffffff00000000);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  local_158 = (thread *)&threadresult;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72d11,(size_t)&local_130,0x4bf,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x4c2;
  file_09.m_begin = (iterator)&local_330;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_340,
             msg_09);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)write(fd[1],&LockCommand,1);
  local_180 = (thread *)&processstatus;
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c46,(size_t)&local_130,0x4c2,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x4c3;
  file_10.m_begin = (iterator)&local_360;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_370,
             msg_10);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)read(fd[1],(thread *)&ch,1);
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c64,(size_t)&local_130,0x4c3,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x4c4;
  file_11.m_begin = (iterator)&local_380;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_390,
             msg_11);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ch == '\x04');
  local_348._M_id._M_thread._0_1_ = 4;
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013ad180;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b1120;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  local_158 = (thread *)&ch;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf898ef,(size_t)&local_130,0x4c4,&local_150,
             "ResErrorLock",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  ReleaseDirectoryLocks();
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x4c9;
  file_12.m_begin = (iterator)&local_3a0;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b0,
             msg_12);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,true);
  local_348._M_id._M_thread._0_4_ = LVar4;
  processstatus = 0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72cca,(size_t)&local_130,0x4c9,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x4cc;
  file_13.m_begin = (iterator)&local_3c0;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3d0,
             msg_13);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)write(fd[1],&LockCommand,1);
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c46,(size_t)&local_130,0x4cc,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x4cd;
  file_14.m_begin = (iterator)&local_3e0;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3f0,
             msg_14);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)read(fd[1],(thread *)&ch,1);
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c64,(size_t)&local_130,0x4cd,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x4ce;
  file_15.m_begin = (iterator)&local_400;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_410,
             msg_15);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ch == '\x02');
  local_348._M_id._M_thread._0_1_ = 2;
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013ad180;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b1120;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  local_158 = (thread *)&ch;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf898ef,(size_t)&local_130,0x4ce,&local_150,
             "ResSuccess",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x4d1;
  file_16.m_begin = (iterator)&local_420;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_430,
             msg_16);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,true);
  local_348._M_id._M_thread._0_4_ = LVar4;
  processstatus = 2;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == ErrorLock);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72cca,(size_t)&local_130,0x4d1,&local_150,
             "util::LockResult::ErrorLock",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x4d4;
  file_17.m_begin = (iterator)&local_440;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_450,
             msg_17);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)write(fd[1],&UnlockCommand,1);
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72d52,(size_t)&local_130,0x4d4,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x4d5;
  file_18.m_begin = (iterator)&local_460;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_470,
             msg_18);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)read(fd[1],(thread *)&ch,1);
  processstatus = 1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c64,(size_t)&local_130,0x4d5,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x4d6;
  file_19.m_begin = (iterator)&local_480;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_490,
             msg_19);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ch == '\x05');
  local_348._M_id._M_thread._0_1_ = 5;
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013ad180;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b1120;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_180 = &local_348;
  local_158 = (thread *)&ch;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf898ef,(size_t)&local_130,0x4d6,&local_150,
             "ResUnlockSuccess",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x4d9;
  file_20.m_begin = (iterator)&local_4a0;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4b0,
             msg_20);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  LVar4 = util::LockDirectory(&dirname,&lockname,true);
  local_348._M_id._M_thread._0_4_ = LVar4;
  processstatus = 0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(LVar4 == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)&processstatus;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = &local_348;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72cca,(size_t)&local_130,0x4d9,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x4df;
  file_21.m_begin = (iterator)&local_4c0;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4d0,
             msg_21);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)write(fd[1],&LockCommand,1);
  local_180 = (thread *)local_4d4;
  local_4d4 = (undefined1  [4])0x1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &local_348;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c46,(size_t)&local_130,0x4df,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x4e3;
  file_22.m_begin = (iterator)&local_4e8;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4f8,
             msg_22);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread = (id)write(fd[1],&ExitCommand,1);
  local_4d4 = (undefined1  [4])0x1;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_348._M_id._M_thread == 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &local_348;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abed0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)local_4d4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72d83,(size_t)&local_130,0x4e3,&local_150,"1",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x4e4;
  file_23.m_begin = (iterator)&local_508;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_518,
             msg_23);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  _Var5 = waitpid(pid,&processstatus,0);
  local_180 = (thread *)&pid;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_Var5 == pid);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &local_348;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abcf0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_348._M_id._M_thread._0_4_ = _Var5;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72da1,(size_t)&local_130,0x4e4,&local_150,"pid",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x4e5;
  file_24.m_begin = (iterator)&local_528;
  msg_24.m_end = pvVar7;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_538,
             msg_24);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(processstatus == 0);
  local_348._M_id._M_thread._0_4_ = 0;
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abcf0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = &local_348;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_158 = (thread *)&processstatus;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72dc1,(size_t)&local_130,0x4e5,&local_150,"0",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x4e6;
  file_25.m_begin = (iterator)&local_548;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_558,
             msg_25);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread._0_4_ = util::LockDirectory(&dirname,&lockname,true);
  local_4d4 = (undefined1  [4])0x0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((LockResult)local_348._M_id._M_thread == Success);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &local_348;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013b13a0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)local_4d4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013b13a0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72cca,(size_t)&local_130,0x4e6,&local_150,
             "util::LockResult::Success",&local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  signal(0x11,__handler);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x4ea;
  file_26.m_begin = (iterator)&local_568;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_578,
             msg_26);
  local_1c0.m_empty = false;
  local_1c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = "";
  local_348._M_id._M_thread._0_4_ = close(fd[1]);
  local_4d4 = (undefined1  [4])0x0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((LockResult)local_348._M_id._M_thread == 0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  local_158 = &local_348;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_013abcf0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_158;
  local_180 = (thread *)local_4d4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013abcf0;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_1c0,1,2,REQUIRE,0xf72c2c,(size_t)&local_130,0x4ea,&local_150,"0",
             &local_178);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  ReleaseDirectoryLocks();
  std::filesystem::remove_all(&dirname.super_path);
  if (thr._M_id._M_thread != 0) {
    std::terminate();
  }
  std::filesystem::__cxx11::path::~path(&lockname.super_path);
  std::filesystem::__cxx11::path::~path(&dirname.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0073f492:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LockDirectory)
{
    fs::path dirname = m_args.GetDataDirBase() / "lock_dir";
    const fs::path lockname = ".lock";
#ifndef WIN32
    // Revert SIGCHLD to default, otherwise boost.test will catch and fail on
    // it: there is BOOST_TEST_IGNORE_SIGCHLD but that only works when defined
    // at build-time of the boost library
    void (*old_handler)(int) = signal(SIGCHLD, SIG_DFL);

    // Fork another process for testing before creating the lock, so that we
    // won't fork while holding the lock (which might be undefined, and is not
    // relevant as test case as that is avoided with -daemonize).
    int fd[2];
    BOOST_CHECK_EQUAL(socketpair(AF_UNIX, SOCK_STREAM, 0, fd), 0);
    pid_t pid = fork();
    if (!pid) {
        BOOST_CHECK_EQUAL(close(fd[1]), 0); // Child: close parent end
        TestOtherProcess(dirname, lockname, fd[0]);
    }
    BOOST_CHECK_EQUAL(close(fd[0]), 0); // Parent: close child end

    char ch;
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorWrite);
#endif
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::ErrorWrite);

    fs::create_directories(dirname);

    // Probing lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Persistent lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from the same thread should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from a different thread within the same process should succeed
    util::LockResult threadresult;
    std::thread thr([&] { threadresult = util::LockDirectory(dirname, lockname); });
    thr.join();
    BOOST_CHECK_EQUAL(threadresult, util::LockResult::Success);
#ifndef WIN32
    // Try to acquire lock in child process while we're holding it, this should fail.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorLock);

    // Give up our lock
    ReleaseDirectoryLocks();
    // Probing lock from our side now should succeed, but not hold on to the lock.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Try to acquire the lock in the child process, this should be successful.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResSuccess);

    // When we try to probe the lock now, it should fail.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::ErrorLock);

    // Unlock the lock in the child process
    BOOST_CHECK_EQUAL(write(fd[1], &UnlockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResUnlockSuccess);

    // When we try to probe the lock now, it should succeed.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Re-lock the lock in the child process, then wait for it to exit, check
    // successful return. After that, we check that exiting the process
    // has released the lock as we would expect by probing it.
    int processstatus;
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    // The following line invokes the ~CNetCleanup dtor without
    // a paired SetupNetworking call. This is acceptable as long as
    // ~CNetCleanup is a no-op for non-Windows platforms.
    BOOST_CHECK_EQUAL(write(fd[1], &ExitCommand, 1), 1);
    BOOST_CHECK_EQUAL(waitpid(pid, &processstatus, 0), pid);
    BOOST_CHECK_EQUAL(processstatus, 0);
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Restore SIGCHLD
    signal(SIGCHLD, old_handler);
    BOOST_CHECK_EQUAL(close(fd[1]), 0); // Close our side of the socketpair
#endif
    // Clean up
    ReleaseDirectoryLocks();
    fs::remove_all(dirname);
}